

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int ret;
  char *_name_16;
  ENGINE *qatengine;
  char *engine_name;
  char *_name_15;
  char *_name_14;
  char *_name_13;
  char *_name_12;
  char *_name_11;
  ptls_context_t minicrypto_ctx;
  undefined1 local_428 [8];
  ptls_iovec_t minicrypto_certificate;
  ptls_minicrypto_secp256r1sha256_sign_certificate_t minicrypto_sign_certificate;
  char *_name_10;
  char *_name_9;
  char *_name_8;
  char *_name_7;
  char *_name_6;
  char *_name_5;
  char *_name_4;
  char *_name_3;
  char *_name_2;
  undefined4 uStack_39c;
  long local_398;
  size_t i_5;
  undefined4 uStack_384;
  long local_380;
  size_t i_4;
  undefined4 uStack_36c;
  long local_368;
  size_t i_3;
  undefined4 uStack_354;
  long local_350;
  size_t i_2;
  undefined4 uStack_33c;
  long local_338;
  size_t i_1;
  undefined4 uStack_324;
  long local_320;
  size_t i;
  ptls_context_t openssl_ctx_sha256only;
  ptls_context_t openssl_ctx;
  X509_STORE *cert_store;
  ptls_iovec_t cert;
  char *_name_1;
  char *_name;
  OSSL_PROVIDER *dflt;
  OSSL_PROVIDER *legacy;
  ptls_ech_create_opener_t ech_create_opener;
  ptls_openssl_verify_certificate_t openssl_verify_certificate;
  ptls_openssl_sign_certificate_t openssl_sign_certificate;
  char **argv_local;
  int argc_local;
  
  legacy = (OSSL_PROVIDER *)create_ech_opener;
  OPENSSL_init_crypto(2,0);
  OPENSSL_init_crypto(0xc,0);
  uVar2 = OSSL_PROVIDER_load(0,"legacy");
  uVar3 = OSSL_PROVIDER_load(0,"default");
  enter_subtest("bf");
  test_bf();
  exit_subtest("bf");
  cert.len = (size_t)anon_var_dwarf_1d687;
  enter_subtest("key-exchange");
  test_key_exchanges();
  exit_subtest((char *)cert.len);
  setup_certificate((ptls_iovec_t *)&cert_store);
  setup_sign_certificate
            ((ptls_openssl_sign_certificate_t *)&openssl_verify_certificate.override_callback);
  openssl_ctx._312_8_ = X509_STORE_new();
  X509_STORE_set_verify_cb((X509_STORE *)openssl_ctx._312_8_,verify_cert_cb);
  ptls_openssl_init_verify_certificate
            ((ptls_openssl_verify_certificate_t *)&ech_create_opener,
             (X509_STORE *)openssl_ctx._312_8_);
  openssl_ctx_sha256only._312_8_ = ptls_openssl_random_bytes;
  openssl_ctx.random_bytes = (_func_void_void_ptr_size_t *)&ptls_get_time;
  openssl_ctx.get_time = (ptls_get_time_t *)ptls_openssl_key_exchanges;
  openssl_ctx.key_exchanges = (ptls_key_exchange_algorithm_t **)ptls_openssl_cipher_suites_all;
  openssl_ctx.cipher_suites = (ptls_cipher_suite_t **)&cert_store;
  openssl_ctx.certificates.list = (ptls_iovec_t *)0x1;
  memset(&openssl_ctx.certificates.count,0,0x28);
  openssl_ctx.pre_shared_key.hash = (ptls_hash_algorithm_t *)ptls_openssl_hpke_cipher_suites;
  openssl_ctx.ech.client.ciphers = (ptls_hpke_cipher_suite_t **)ptls_openssl_hpke_kems;
  openssl_ctx.ech.client.kems = (ptls_hpke_kem_t **)&legacy;
  openssl_ctx.ech.server.create_opener = (ptls_ech_create_opener_t *)anon_var_dwarf_1d69e;
  openssl_ctx.ech.server.retry_configs.base = (uint8_t *)0x65;
  openssl_ctx.ech.server.retry_configs.len = 0;
  openssl_ctx.on_client_hello = (ptls_on_client_hello_t *)0x0;
  openssl_ctx.emit_certificate =
       (ptls_emit_certificate_t *)&openssl_verify_certificate.override_callback;
  openssl_ctx.sign_certificate = (ptls_sign_certificate_t *)0x0;
  openssl_ctx.verify_certificate._0_4_ = 0;
  openssl_ctx.verify_certificate._4_4_ = 0;
  openssl_ctx.ticket_lifetime = 0;
  openssl_ctx.max_early_data_size = 0;
  openssl_ctx.max_buffer_size = 0;
  openssl_ctx.hkdf_label_prefix__obsolete._0_1_ = 0;
  openssl_ctx._184_8_ = 0;
  openssl_ctx.encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
  openssl_ctx.save_ticket = (ptls_save_ticket_t *)0x0;
  openssl_ctx.log_event = (ptls_log_event_t *)0x0;
  openssl_ctx.update_open_count = (ptls_update_open_count_t *)0x0;
  openssl_ctx.update_traffic_key = (ptls_update_traffic_key_t *)0x0;
  openssl_ctx.decompress_certificate = (ptls_decompress_certificate_t *)0x0;
  openssl_ctx.on_extension = (ptls_on_extension_t *)ptls_openssl_tls12_cipher_suites;
  memset(&openssl_ctx.tls12_cipher_suites,0,0x24);
  memset(&openssl_ctx.ticket_context.field_0x20,0,0x10);
  memset(&openssl_ctx.client_ca_names.count,0,3);
  memcpy(&i,&openssl_ctx_sha256only.ticket_requests,0x140);
  while (*(long *)((*openssl_ctx_sha256only.key_exchanges)->exchange + 0x10) != 0x20) {
    if ((*(long *)((*openssl_ctx.key_exchanges)->exchange + 0x10) != 0x40) &&
       (*(long *)((*openssl_ctx.key_exchanges)->exchange + 0x10) != 0x30)) {
      __assert_fail("openssl_ctx.cipher_suites[0]->hash->digest_size == 64 || openssl_ctx.cipher_suites[0]->hash->digest_size == 48"
                    ,"/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",
                    0x23c,"int main(int, char **)");
    }
    openssl_ctx_sha256only.key_exchanges = openssl_ctx_sha256only.key_exchanges + 1;
  }
  if (*(long *)((*openssl_ctx_sha256only.key_exchanges)->exchange + 0x10) != 0x20) {
    __assert_fail("openssl_ctx_sha256only.cipher_suites[0]->hash->digest_size == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",
                  0x23f,"int main(int, char **)");
  }
  ctx_peer = (ptls_context_t *)&openssl_ctx_sha256only.ticket_requests;
  ctx = (ptls_context_t *)&openssl_ctx_sha256only.ticket_requests;
  verify_certificate = (ptls_verify_certificate_t *)&ech_create_opener;
  for (local_320 = 0; ffx_variants[local_320].algo != (ptls_cipher_algorithm_t *)0x0;
      local_320 = local_320 + 1) {
  }
  ffx_variants[local_320].algo = &ptls_ffx_ptls_openssl_aes128ctr_b125_r8;
  *(ulong *)&ffx_variants[local_320].bit_length = CONCAT44(uStack_324,0x7d);
  for (local_338 = 0; ffx_variants[local_338].algo != (ptls_cipher_algorithm_t *)0x0;
      local_338 = local_338 + 1) {
  }
  ffx_variants[local_338].algo = &ptls_ffx_ptls_openssl_aes128ctr_b31_r6;
  *(ulong *)&ffx_variants[local_338].bit_length = CONCAT44(uStack_33c,0x1f);
  for (local_350 = 0; ffx_variants[local_350].algo != (ptls_cipher_algorithm_t *)0x0;
      local_350 = local_350 + 1) {
  }
  ffx_variants[local_350].algo = &ptls_ffx_ptls_openssl_aes128ctr_b53_r4;
  *(ulong *)&ffx_variants[local_350].bit_length = CONCAT44(uStack_354,0x35);
  for (local_368 = 0; ffx_variants[local_368].algo != (ptls_cipher_algorithm_t *)0x0;
      local_368 = local_368 + 1) {
  }
  ffx_variants[local_368].algo = &ptls_ffx_ptls_openssl_chacha20_b256_r8;
  *(ulong *)&ffx_variants[local_368].bit_length = CONCAT44(uStack_36c,0x100);
  for (local_380 = 0; ffx_variants[local_380].algo != (ptls_cipher_algorithm_t *)0x0;
      local_380 = local_380 + 1) {
  }
  ffx_variants[local_380].algo = &ptls_ffx_ptls_openssl_chacha20_b32_r6;
  *(ulong *)&ffx_variants[local_380].bit_length = CONCAT44(uStack_384,0x20);
  for (local_398 = 0; ffx_variants[local_398].algo != (ptls_cipher_algorithm_t *)0x0;
      local_398 = local_398 + 1) {
  }
  ffx_variants[local_398].algo = &ptls_ffx_ptls_openssl_chacha20_b57_r4;
  *(ulong *)&ffx_variants[local_398].bit_length = CONCAT44(uStack_39c,0x39);
  enter_subtest("sha");
  test_sha();
  exit_subtest("sha");
  enter_subtest("rsa-sign");
  test_rsa_sign();
  exit_subtest("rsa-sign");
  enter_subtest("ecdsa-sign");
  test_ecdsa_sign();
  exit_subtest("ecdsa-sign");
  enter_subtest("ed25519-sign");
  test_ed25519_sign();
  exit_subtest("ed25519-sign");
  enter_subtest("cert-verify");
  test_cert_verify();
  exit_subtest("cert-verify");
  enter_subtest("picotls");
  test_picotls();
  exit_subtest("picotls");
  ctx_peer = (ptls_context_t *)&i;
  ctx = (ptls_context_t *)&i;
  enter_subtest("picotls");
  test_picotls();
  exit_subtest("picotls");
  ctx = (ptls_context_t *)&i;
  ctx_peer = (ptls_context_t *)&openssl_ctx_sha256only.ticket_requests;
  enter_subtest("picotls");
  test_picotls();
  exit_subtest("picotls");
  ctx = (ptls_context_t *)&openssl_ctx_sha256only.ticket_requests;
  ctx_peer = (ptls_context_t *)&i;
  enter_subtest("picotls");
  test_picotls();
  exit_subtest("picotls");
  _local_428 = ptls_iovec_init(anon_var_dwarf_1d75f,0x264);
  join_0x00000010_0x00000000_ = ptls_iovec_init(anon_var_dwarf_1d777,0x20);
  ptls_minicrypto_init_secp256r1sha256_sign_certificate
            ((ptls_minicrypto_secp256r1sha256_sign_certificate_t *)&minicrypto_certificate.len,
             join_0x00000010_0x00000000_);
  memset(&_name_11,0,0x140);
  _name_11 = (char *)ptls_minicrypto_random_bytes;
  minicrypto_ctx.random_bytes = (_func_void_void_ptr_size_t *)&ptls_get_time;
  minicrypto_ctx.get_time = (ptls_get_time_t *)ptls_minicrypto_key_exchanges;
  minicrypto_ctx.key_exchanges = (ptls_key_exchange_algorithm_t **)ptls_minicrypto_cipher_suites;
  minicrypto_ctx.cipher_suites = (ptls_cipher_suite_t **)local_428;
  minicrypto_ctx.certificates.list = (ptls_iovec_t *)0x1;
  minicrypto_ctx.emit_certificate = (ptls_emit_certificate_t *)&minicrypto_certificate.len;
  ctx = (ptls_context_t *)&openssl_ctx_sha256only.ticket_requests;
  ctx_peer = (ptls_context_t *)&_name_11;
  enter_subtest("vs. minicrypto");
  test_picotls();
  exit_subtest("vs. minicrypto");
  ctx = (ptls_context_t *)&_name_11;
  ctx_peer = (ptls_context_t *)&openssl_ctx_sha256only.ticket_requests;
  enter_subtest("minicrypto vs.");
  test_picotls();
  exit_subtest("minicrypto vs.");
  enter_subtest("hpke");
  test_all_hpke();
  exit_subtest("hpke");
  openssl_ctx.get_time = (ptls_get_time_t *)main::fast_keyex;
  openssl_ctx.key_exchanges = (ptls_key_exchange_algorithm_t **)main::fast_cipher;
  ctx = (ptls_context_t *)&openssl_ctx_sha256only.ticket_requests;
  ctx_peer = (ptls_context_t *)&openssl_ctx_sha256only.ticket_requests;
  enter_subtest("many-handshakes-non-async");
  many_handshakes();
  exit_subtest("many-handshakes-non-async");
  enter_subtest("many-handshakes-async");
  many_handshakes();
  exit_subtest("many-handshakes-async");
  _name_16 = (char *)ENGINE_by_id("qatengine");
  if ((ENGINE *)_name_16 == (ENGINE *)0x0) {
    _name_16 = (char *)load_engine("qatengine");
    if ((ENGINE *)_name_16 == (ENGINE *)0x0) {
      note("%s not found","qatengine");
      goto LAB_001570f7;
    }
  }
  ENGINE_set_default_RSA((ENGINE *)_name_16);
  ptls_openssl_dispose_sign_certificate
            ((ptls_openssl_sign_certificate_t *)&openssl_verify_certificate.override_callback);
  setup_sign_certificate
            ((ptls_openssl_sign_certificate_t *)&openssl_verify_certificate.override_callback);
  enter_subtest("many-handshakes-qatengine");
  many_handshakes();
  exit_subtest("many-handshakes-qatengine");
LAB_001570f7:
  iVar1 = done_testing();
  OSSL_PROVIDER_unload(uVar3);
  OSSL_PROVIDER_unload(uVar2);
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
    ptls_openssl_sign_certificate_t openssl_sign_certificate;
    ptls_openssl_verify_certificate_t openssl_verify_certificate;
    ptls_ech_create_opener_t ech_create_opener = {.cb = create_ech_opener};

    ERR_load_crypto_strings();
    OpenSSL_add_all_algorithms();

#if !defined(LIBRESSL_VERSION_NUMBER) && OPENSSL_VERSION_NUMBER >= 0x30000000L
    /* Explicitly load the legacy provider in addition to default, as we test Blowfish in one of the tests. */
    OSSL_PROVIDER *legacy = OSSL_PROVIDER_load(NULL, "legacy");
    OSSL_PROVIDER *dflt = OSSL_PROVIDER_load(NULL, "default");
#elif !defined(OPENSSL_NO_ENGINE)
    /* Load all compiled-in ENGINEs */
    ENGINE_load_builtin_engines();
    ENGINE_register_all_ciphers();
    ENGINE_register_all_digests();
#endif

    subtest("bf", test_bf);

    subtest("key-exchange", test_key_exchanges);

    ptls_iovec_t cert;
    setup_certificate(&cert);
    setup_sign_certificate(&openssl_sign_certificate);
    X509_STORE *cert_store = X509_STORE_new();
    X509_STORE_set_verify_cb(cert_store, verify_cert_cb);
    ptls_openssl_init_verify_certificate(&openssl_verify_certificate, cert_store);
    /* we should call X509_STORE_free on OpenSSL 1.1 or in prior versions decrement refount then call _free */
    ptls_context_t openssl_ctx = {.random_bytes = ptls_openssl_random_bytes,
                                  .get_time = &ptls_get_time,
                                  .key_exchanges = ptls_openssl_key_exchanges,
                                  .cipher_suites = ptls_openssl_cipher_suites_all,
                                  .tls12_cipher_suites = ptls_openssl_tls12_cipher_suites,
                                  .certificates = {&cert, 1},
                                  .ech = {.client = {.ciphers = ptls_openssl_hpke_cipher_suites, .kems = ptls_openssl_hpke_kems},
                                          .server = {.create_opener = &ech_create_opener,
                                                     .retry_configs = {(uint8_t *)ECH_CONFIG_LIST, sizeof(ECH_CONFIG_LIST) - 1}}},
                                  .sign_certificate = &openssl_sign_certificate.super};
    ptls_context_t openssl_ctx_sha256only = openssl_ctx;
    while (openssl_ctx_sha256only.cipher_suites[0]->hash->digest_size != 32) {
        assert(openssl_ctx.cipher_suites[0]->hash->digest_size == 64 || /* sha512 */
               openssl_ctx.cipher_suites[0]->hash->digest_size == 48);  /* sha384 */
        ++openssl_ctx_sha256only.cipher_suites;
    }
    assert(openssl_ctx_sha256only.cipher_suites[0]->hash->digest_size == 32); /* sha256 */

    ctx = ctx_peer = &openssl_ctx;
    verify_certificate = &openssl_verify_certificate.super;
    ADD_FFX_AES128_ALGORITHMS(openssl);
#if PTLS_OPENSSL_HAVE_CHACHA20_POLY1305
    ADD_FFX_CHACHA20_ALGORITHMS(openssl);
#endif

    subtest("sha", test_sha);
    subtest("rsa-sign", test_rsa_sign);
    subtest("ecdsa-sign", test_ecdsa_sign);
    subtest("ed25519-sign", test_ed25519_sign);
    subtest("cert-verify", test_cert_verify);
    subtest("picotls", test_picotls);

    ctx = ctx_peer = &openssl_ctx_sha256only;
    subtest("picotls", test_picotls);

    ctx = &openssl_ctx_sha256only;
    ctx_peer = &openssl_ctx;
    subtest("picotls", test_picotls);

    ctx = &openssl_ctx;
    ctx_peer = &openssl_ctx_sha256only;
    subtest("picotls", test_picotls);

    ptls_minicrypto_secp256r1sha256_sign_certificate_t minicrypto_sign_certificate;
    ptls_iovec_t minicrypto_certificate = ptls_iovec_init(SECP256R1_CERTIFICATE, sizeof(SECP256R1_CERTIFICATE) - 1);
    ptls_minicrypto_init_secp256r1sha256_sign_certificate(
        &minicrypto_sign_certificate, ptls_iovec_init(SECP256R1_PRIVATE_KEY, sizeof(SECP256R1_PRIVATE_KEY) - 1));
    ptls_context_t minicrypto_ctx = {.random_bytes = ptls_minicrypto_random_bytes,
                                     .get_time = &ptls_get_time,
                                     .key_exchanges = ptls_minicrypto_key_exchanges,
                                     .cipher_suites = ptls_minicrypto_cipher_suites,
                                     .certificates = {&minicrypto_certificate, 1},
                                     .sign_certificate = &minicrypto_sign_certificate.super};
    ctx = &openssl_ctx;
    ctx_peer = &minicrypto_ctx;
    subtest("vs. minicrypto", test_picotls);

    ctx = &minicrypto_ctx;
    ctx_peer = &openssl_ctx;
    subtest("minicrypto vs.", test_picotls);

    subtest("hpke", test_all_hpke);

#if ASYNC_TESTS
    // switch to x25519 / aes128gcmsha256 as we run benchmarks
    static ptls_key_exchange_algorithm_t *fast_keyex[] = {&ptls_openssl_x25519, NULL}; // use x25519 for speed
    static ptls_cipher_suite_t *fast_cipher[] = {&ptls_openssl_aes128gcmsha256, NULL};
    openssl_ctx.key_exchanges = fast_keyex;
    openssl_ctx.cipher_suites = fast_cipher;
    ctx = &openssl_ctx;
    ctx_peer = &openssl_ctx;
    openssl_sign_certificate.async = 0;
    subtest("many-handshakes-non-async", many_handshakes);
    openssl_sign_certificate.async = 0;
    subtest("many-handshakes-async", many_handshakes);
    { /* qatengine should be tested at last, because we do not have the code to unload or un-default it */
        const char *engine_name = "qatengine";
        ENGINE *qatengine;
        if ((qatengine = ENGINE_by_id(engine_name)) != NULL || (qatengine = load_engine(engine_name)) != NULL) {
            ENGINE_set_default_RSA(qatengine);
            ptls_openssl_dispose_sign_certificate(&openssl_sign_certificate); // reload cert to use qatengine
            setup_sign_certificate(&openssl_sign_certificate);
            subtest("many-handshakes-qatengine", many_handshakes);
        } else {
            note("%s not found", engine_name);
        }
    }
#endif

    int ret = done_testing();
#if !defined(LIBRESSL_VERSION_NUMBER) && OPENSSL_VERSION_NUMBER >= 0x30000000L
    OSSL_PROVIDER_unload(dflt);
    OSSL_PROVIDER_unload(legacy);
#endif
    return ret;
}